

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

Blob<128> bitreverse<Blob<128>>(Blob<128> *n,size_t b)

{
  ulong in_RDX;
  ulong extraout_RDX;
  ulong uVar1;
  ulong uVar2;
  Blob<128> BVar3;
  
  n->bytes[0] = '\0';
  n->bytes[1] = '\0';
  n->bytes[2] = '\0';
  n->bytes[3] = '\0';
  n->bytes[4] = '\0';
  n->bytes[5] = '\0';
  n->bytes[6] = '\0';
  n->bytes[7] = '\0';
  n->bytes[8] = '\0';
  n->bytes[9] = '\0';
  n->bytes[10] = '\0';
  n->bytes[0xb] = '\0';
  n->bytes[0xc] = '\0';
  n->bytes[0xd] = '\0';
  n->bytes[0xe] = '\0';
  n->bytes[0xf] = '\0';
  uVar1 = in_RDX;
  if (in_RDX != 0) {
    uVar2 = 0;
    do {
      lshift32(n,0x10,8);
      n->bytes[0] = n->bytes[0] |
                    bitrev(unsigned_char)::revbits[*(uint *)b & 0xf] << 4 |
                    bitrev(unsigned_char)::revbits[*(uint *)b >> 4 & 0xf];
      rshift32((void *)b,0x10,8);
      uVar2 = uVar2 + 8;
      uVar1 = extraout_RDX;
    } while (uVar2 < in_RDX);
  }
  BVar3.bytes[8] = (char)uVar1;
  BVar3.bytes[9] = (char)(uVar1 >> 8);
  BVar3.bytes[10] = (char)(uVar1 >> 0x10);
  BVar3.bytes[0xb] = (char)(uVar1 >> 0x18);
  BVar3.bytes[0xc] = (char)(uVar1 >> 0x20);
  BVar3.bytes[0xd] = (char)(uVar1 >> 0x28);
  BVar3.bytes[0xe] = (char)(uVar1 >> 0x30);
  BVar3.bytes[0xf] = (char)(uVar1 >> 0x38);
  BVar3.bytes._0_8_ = n;
  return (Blob<128>)BVar3.bytes;
}

Assistant:

hashtype bitreverse(hashtype n, size_t b = sizeof(hashtype) * 8)
{
    assert(b <= std::numeric_limits<hashtype>::digits);
    hashtype rv = 0;
    for (size_t i = 0; i < b; i += 8) {
        rv <<= 8;
        rv |= bitrev(n & 0xff); // ensure overloaded |= op for Blob not underflowing
        n >>= 8;
    }
    return rv;
}